

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void * cmAddSource(void *arg,void *arg2)

{
  cmSourceFileLocation *pcVar1;
  bool bVar2;
  ulong uVar3;
  cmSourceFile *pcVar4;
  size_type *this;
  pointer pcVar5;
  mapped_type *this_00;
  cmCPluginAPISourceFile *value;
  __single_object sf;
  string *d;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmPropertyMap local_70;
  cmSourceFile *local_38;
  cmSourceFile *rsf;
  cmCPluginAPISourceFile *osf;
  cmMakefile *mf;
  void *arg2_local;
  void *arg_local;
  
  rsf = (cmSourceFile *)arg2;
  osf = (cmCPluginAPISourceFile *)arg;
  mf = (cmMakefile *)arg2;
  arg2_local = arg;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = cmMakefile::GetOrCreateSource
                       ((cmMakefile *)osf,(string *)((long)&(rsf->Location).Name.field_2 + 8),false,
                        Ambiguous);
    local_38 = pcVar4;
    cmPropertyMap::cmPropertyMap
              (&local_70,(cmPropertyMap *)&(rsf->Properties).Map_._M_h._M_single_bucket);
    cmSourceFile::SetProperties(pcVar4,&local_70);
    cmPropertyMap::~cmPropertyMap(&local_70);
    bVar2 = cmSourceFile::GetIsGenerated(local_38,GlobalAndLocal);
    if (bVar2) {
      cmSourceFile::MarkAsGenerated(local_38);
    }
    this = &(rsf->Properties).Map_._M_h._M_element_count;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this);
    d = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&d), bVar2) {
      sf._M_t.
      super___uniq_ptr_impl<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>.
      _M_t.
      super__Tuple_impl<0UL,_cmCPluginAPISourceFile_*,_std::default_delete<cmCPluginAPISourceFile>_>
      .super__Head_base<0UL,_cmCPluginAPISourceFile_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>,_true,_true>
            )__gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
      cmSourceFile::AddDepend
                (local_38,(string *)
                          sf._M_t.
                          super___uniq_ptr_impl<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCPluginAPISourceFile_*,_std::default_delete<cmCPluginAPISourceFile>_>
                          .super__Head_base<0UL,_cmCPluginAPISourceFile_*,_false>._M_head_impl);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::make_unique<cmCPluginAPISourceFile>();
    pcVar4 = local_38;
    pcVar5 = std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>::
             operator->((unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
                         *)&value);
    pcVar5->RealSourceFile = pcVar4;
    pcVar1 = &rsf->Location;
    pcVar5 = std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>::
             operator->((unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
                         *)&value);
    std::__cxx11::string::operator=
              ((string *)&pcVar5->FullPath,(string *)((pcVar1->Name).field_2._M_local_buf + 8));
    pcVar1 = &rsf->Location;
    pcVar5 = std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>::
             operator->((unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
                         *)&value);
    std::__cxx11::string::operator=
              ((string *)&pcVar5->SourceName,(string *)&pcVar1->AmbiguousDirectory);
    pcVar1 = &rsf->Location;
    pcVar5 = std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>::
             operator->((unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
                         *)&value);
    std::__cxx11::string::operator=
              ((string *)&pcVar5->SourceExtension,
               (string *)((pcVar1->Directory).field_2._M_local_buf + 8));
    pcVar5 = std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>::
             get((unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_> *
                 )&value);
    this_00 = std::
              map<cmSourceFile_*,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>_>_>_>
              ::operator[](&cmCPluginAPISourceFiles,&local_38);
    std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>::operator=
              (this_00,(unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
                        *)&value);
    arg_local = pcVar5;
    std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>::
    ~unique_ptr((unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_> *)
                &value);
  }
  else {
    arg_local = (void *)0x0;
  }
  return arg_local;
}

Assistant:

static void* CCONV cmAddSource(void* arg, void* arg2)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmCPluginAPISourceFile* osf = static_cast<cmCPluginAPISourceFile*>(arg2);
  if (osf->FullPath.empty()) {
    return nullptr;
  }

  // Create the real cmSourceFile instance and copy over saved information.
  cmSourceFile* rsf = mf->GetOrCreateSource(osf->FullPath);
  rsf->SetProperties(osf->Properties);
  // In case the properties contain the GENERATED property,
  // mark the real cmSourceFile as generated.
  if (rsf->GetIsGenerated()) {
    rsf->MarkAsGenerated();
  }
  for (std::string const& d : osf->Depends) {
    rsf->AddDepend(d);
  }

  // Create the proxy for the real source file.
  auto sf = cm::make_unique<cmCPluginAPISourceFile>();
  sf->RealSourceFile = rsf;
  sf->FullPath = osf->FullPath;
  sf->SourceName = osf->SourceName;
  sf->SourceExtension = osf->SourceExtension;

  // Store the proxy in the map so it can be re-used and deleted later.
  auto* value = sf.get();
  cmCPluginAPISourceFiles[rsf] = std::move(sf);
  return value;
}